

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

LiteralBoolean * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,bool *args_2)

{
  LiteralBoolean *lr;
  Fodder *in_RDI;
  LiteralBoolean *r;
  undefined1 in_stack_ffffffffffffffaf;
  LiteralBoolean *in_stack_ffffffffffffffc0;
  
  lr = (LiteralBoolean *)operator_new(0x88);
  LiteralBoolean::LiteralBoolean
            (in_stack_ffffffffffffffc0,(LocationRange *)lr,in_RDI,(bool)in_stack_ffffffffffffffaf);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)lr,
             (value_type *)lr);
  return lr;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }